

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_setHighsBoolOptionValue(void *highs,char *option,HighsInt value)

{
  HighsInt HVar1;
  string *alt_method_name;
  string *in_stack_ffffffffffffff88;
  Highs *in_stack_ffffffffffffff90;
  HighsInt in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  
  alt_method_name = (string *)&stack0xffffffffffffffc7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffc8,"Highs_setHighsBoolOptionValue",
             (allocator *)alt_method_name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff90,"Highs_setBoolOptionValue",
             (allocator *)&stack0xffffffffffffff8f);
  Highs::deprecationMessage(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,alt_method_name);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  HVar1 = Highs_setBoolOptionValue
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  return HVar1;
}

Assistant:

HighsInt Highs_setHighsBoolOptionValue(void* highs, const char* option,
                                       const HighsInt value) {
  ((Highs*)highs)
      ->deprecationMessage("Highs_setHighsBoolOptionValue",
                           "Highs_setBoolOptionValue");
  return Highs_setBoolOptionValue(highs, option, value);
}